

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O1

uint8_t * bstr_match_cstr(uint8_t *pBegin,uint8_t *pEnd,char *cstr)

{
  int *piVar1;
  size_t sVar2;
  uint8_t *puVar3;
  
  if ((pEnd != (uint8_t *)0x0 && pBegin != (uint8_t *)0x0) &&
     (pBegin <= pEnd && cstr != (char *)0x0)) {
    sVar2 = strlen(cstr);
    puVar3 = bstr_match_bstr(pBegin,pEnd,(uint8_t *)cstr,(uint8_t *)(cstr + sVar2));
    return puVar3;
  }
  piVar1 = __errno_location();
  *piVar1 = 0x16;
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t *bstr_match_cstr(const uint8_t *pBegin, const uint8_t *pEnd, const char *cstr)
{
   const uint8_t *pStrBegin = (const uint8_t*) cstr;
   const uint8_t *pStrEnd;
   if ( (pBegin == 0) || (pEnd == 0) || (pEnd < pBegin) || (cstr == 0) )
   {
      errno = EINVAL; //invalid arguments
      return 0;
   }
   pStrEnd = pStrBegin + strlen(cstr);
   return bstr_match_bstr(pBegin, pEnd, pStrBegin, pStrEnd);
}